

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

char16 * Js::FunctionProxy::WrapWithBrackets
                   (char16 *name,charcount_t sz,ScriptContext *scriptContext)

{
  Recycler *this;
  char16_t *pcVar1;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0xab8;
  data.plusSize = (ulong)(sz + 3);
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_48);
  pcVar1 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                     ((Memory *)this,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)(sz + 3));
  *pcVar1 = L'[';
  js_wmemcpy_s(pcVar1 + 1,(ulong)sz,name,(ulong)sz);
  pcVar1[sz + 1] = L']';
  pcVar1[sz + 2] = L'\0';
  return pcVar1;
}

Assistant:

const char16* FunctionProxy::WrapWithBrackets(const char16* name, charcount_t sz, ScriptContext* scriptContext)
    {
        char16 * wrappedName = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, sz + 3); //[]\0
        wrappedName[0] = _u('[');
        char16 *next = wrappedName;
        js_wmemcpy_s(++next, sz, name, sz);
        wrappedName[sz + 1] = _u(']');
        wrappedName[sz + 2] = _u('\0');
        return wrappedName;

    }